

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEdit.cpp
# Opt level: O2

void __thiscall GraphEdit::paintEvent(GraphEdit *this,QPaintEvent *evt)

{
  QRect *rect;
  int iVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QWidget *this_00;
  QWidget *pQVar8;
  int iVar9;
  int iVar10;
  QPainter painter;
  BarPlotter plotter;
  QFontMetrics metrics;
  QPoint local_38;
  
  this_00 = (QWidget *)QAbstractScrollArea::viewport();
  pQVar8 = this_00 + 0x10;
  if (this_00 == (QWidget *)0x0) {
    pQVar8 = (QWidget *)0x0;
  }
  QPainter::QPainter(&painter,(QPaintDevice *)pQVar8);
  plotter._0_16_ = QWidget::rect(this_00);
  QPainter::fillRect((QRect *)&painter,(QColor *)&plotter);
  QAbstractScrollArea::horizontalScrollBar();
  QAbstractScrollArea::verticalScrollBar();
  iVar3 = QAbstractSlider::minimum();
  iVar4 = QAbstractSlider::maximum();
  if (iVar3 == iVar4) {
    iVar3 = this->mMinValue;
    iVar4 = this->mMaxValue;
  }
  else {
    iVar3 = QAbstractSlider::maximum();
    iVar9 = QAbstractSlider::value();
    iVar10 = QAbstractSlider::minimum();
    iVar4 = QAbstractSlider::pageStep();
    iVar3 = (iVar10 - iVar9) + iVar3;
    iVar4 = iVar4 + iVar3;
  }
  QWidget::fontMetrics((QWidget *)&metrics);
  QPainter::setPen((QColor *)&painter);
  iVar9 = this->mYAxisWidth;
  iVar10 = (this->mPlotRect).y1;
  iVar5 = QFontMetrics::height();
  QString::number((int)&plotter,iVar4);
  QPainter::drawText(&painter,8,iVar10,iVar9,iVar5,0x22,(QString *)&plotter,(QRect *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&plotter);
  iVar9 = *(int *)(*(long *)(this_00 + 0x20) + 0x18);
  iVar10 = *(int *)(*(long *)(this_00 + 0x20) + 0x20);
  iVar6 = QFontMetrics::height();
  iVar5 = this->mYAxisWidth;
  iVar7 = QFontMetrics::height();
  QString::number((int)&plotter,iVar3);
  QPainter::drawText(&painter,8,(iVar10 - (iVar9 + iVar6)) + -7,iVar5,iVar7,0x42,(QString *)&plotter
                     ,(QRect *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&plotter);
  QPainter::setPen((QColor *)&painter);
  iVar9 = (this->mPlotRect).x1;
  iVar7 = (this->mPlotRect).y1 + -1;
  iVar10 = (this->mPlotRect).y2;
  iVar5 = *(int *)(*(long *)(this_00 + 0x20) + 0x1c);
  iVar6 = *(int *)(*(long *)(this_00 + 0x20) + 0x14);
  QPainter::drawLine(&painter,iVar9 + -1,iVar7,iVar9 + -1,iVar10);
  iVar5 = (iVar5 - iVar6) + 1;
  QPainter::drawLine(&painter,iVar9,iVar7,iVar5,iVar7);
  QPainter::drawLine(&painter,iVar9,iVar10,iVar5,iVar10);
  rect = &this->mPlotRect;
  if (this->mBarMode == true) {
    GraphEditTU::BarPlotter::BarPlotter(&plotter,rect,this->mMinValue,this->mMaxValue);
    iVar3 = this->mMinValue;
    if (this->mLines == true) {
      iVar4 = iVar3 * 0x1000000;
      while( true ) {
        iVar4 = iVar4 + 0x1000000;
        iVar3 = iVar3 + 1;
        if (this->mMaxValue <= iVar3) break;
        iVar9 = plotter.mBottom -
                (((iVar4 >> 0x18) - plotter.mMin) * plotter.mHeight) / plotter.mRange;
        QPainter::drawLine(&painter,rect->x1,iVar9,iVar5,iVar9);
      }
      iVar3 = this->mMinValue;
    }
    if (iVar3 != 0) {
      QPainter::drawLine(&painter,rect->x1,plotter.mXAxis,iVar5,plotter.mXAxis);
    }
    local_38.xp = rect->x1;
    local_38.yp = 0;
    QPainter::translate(&painter,&local_38);
    QPainter::setPen((QColor *)&painter);
    if ((this->mMouseOver).super__Optional_base<QPoint,_true,_true>._M_payload.
        super__Optional_payload_base<QPoint>._M_engaged == true) {
      QPainter::drawRect(&painter,(this->mMouseOver).super__Optional_base<QPoint,_true,_true>.
                                  _M_payload.super__Optional_payload_base<QPoint>._M_payload.
                                  _M_value.xp * this->mCellWidth,plotter.mXAxis,this->mCellWidth,
                         plotter.mBottom -
                         (((*(char *)((long)&(this->mMouseOver).
                                             super__Optional_base<QPoint,_true,_true>._M_payload.
                                             super__Optional_payload_base<QPoint>._M_payload + 4) -
                           plotter.mMin) * plotter.mHeight) / plotter.mRange + plotter.mXAxis));
    }
    iVar4 = (**(code **)(*(long *)this->mModel + 0x60))();
    iVar3 = QAbstractSlider::value();
    iVar9 = 1;
    for (; iVar3 < iVar4; iVar3 = iVar3 + 1) {
      cVar2 = (**(code **)(*(long *)this->mModel + 0x68))(this->mModel,iVar3);
      iVar10 = (plotter.mBottom - ((cVar2 - plotter.mMin) * plotter.mHeight) / plotter.mRange) -
               plotter.mXAxis;
      if (iVar10 == 0) {
        iVar10 = 1;
      }
      QPainter::fillRect(&painter,iVar9,plotter.mXAxis,this->mCellWidth + -1,iVar10,
                         &this->mSampleColor);
      iVar9 = iVar9 + this->mCellWidth;
    }
  }
  else {
    iVar9 = (this->mPlotRect).y1;
    iVar10 = this->mCellHeight;
    for (iVar6 = (this->mPlotRect).y2 - iVar10; iVar9 < iVar6; iVar6 = iVar6 - iVar10) {
      QPainter::drawLine(&painter,rect->x1,iVar6,iVar5,iVar6);
      iVar10 = this->mCellHeight;
    }
    iVar9 = (this->mPlotRect).y2;
    iVar6 = this->mAlternateInterval;
    if (iVar6 != 0) {
      iVar7 = iVar3 % iVar6;
      if (iVar7 < 0) {
        iVar7 = -iVar7;
      }
      else {
        iVar7 = (iVar6 - iVar7) % iVar6;
      }
      iVar6 = iVar6 * iVar10;
      iVar1 = (this->mPlotRect).y1;
      for (iVar9 = iVar9 - iVar7 * iVar10; iVar10 = this->mCellHeight, iVar1 < iVar9;
          iVar9 = iVar9 - iVar6) {
        QPainter::fillRect(&painter,rect->x1,(iVar9 - iVar10) + 1,iVar5,iVar10 + -1,
                           &this->mAlternateColor);
      }
      iVar9 = (this->mPlotRect).y2;
    }
    plotter.mMin = iVar10 * iVar3 + iVar9;
    plotter.mRange = rect->x1;
    QPainter::translate(&painter,(QPoint *)&plotter);
    QPainter::scale(1.0,-1.0);
    QPainter::setPen((QColor *)&painter);
    if ((this->mMouseOver).super__Optional_base<QPoint,_true,_true>._M_payload.
        super__Optional_payload_base<QPoint>._M_engaged == true) {
      QPainter::drawRect(&painter,(this->mMouseOver).super__Optional_base<QPoint,_true,_true>.
                                  _M_payload.super__Optional_payload_base<QPoint>._M_payload.
                                  _M_value.xp * this->mCellWidth,
                         ((this->mMouseOver).super__Optional_base<QPoint,_true,_true>._M_payload.
                          super__Optional_payload_base<QPoint>._M_payload._M_value.yp + iVar3) *
                         this->mCellHeight,this->mCellWidth,this->mCellHeight);
    }
    iVar5 = (**(code **)(*(long *)this->mModel + 0x60))();
    iVar10 = QAbstractSlider::value();
    iVar9 = 1;
    for (; iVar10 < iVar5; iVar10 = iVar10 + 1) {
      cVar2 = (**(code **)(*(long *)this->mModel + 0x68))(this->mModel,iVar10);
      iVar6 = (int)cVar2;
      if ((iVar3 <= iVar6) && (iVar6 <= iVar4)) {
        QPainter::fillRect(&painter,iVar9,iVar6 * this->mCellHeight,this->mCellWidth + -1,
                           this->mCellHeight + -1,&this->mSampleColor);
      }
      iVar9 = iVar9 + this->mCellWidth;
    }
  }
  QFontMetrics::~QFontMetrics(&metrics);
  QPainter::~QPainter(&painter);
  return;
}

Assistant:

void GraphEdit::paintEvent(QPaintEvent *evt) {
    Q_UNUSED(evt)

    // paint on the viewport widget
    auto _viewport = viewport();
    QPainter painter(_viewport);

    // doing this manually instead of using auto-fill background because changing the
    // background role color in QPalette has no effect (tried both this widgets and the viewport widgets palette)
    painter.fillRect(_viewport->rect(), mBackgroundColor);

    auto hscroll = horizontalScrollBar();
    auto vscroll = verticalScrollBar();
    
    int viewportMin;
    int viewportMax;
    if (vscroll->minimum() == vscroll->maximum()) {
        viewportMin = mMinValue;
        viewportMax = mMaxValue;
    } else {
        auto value = vscroll->maximum() - (vscroll->value() - vscroll->minimum());
        viewportMin = value;
        viewportMax = value + vscroll->pageStep();
    }

    auto metrics = fontMetrics();

    // viewport minimum/maximum or just minimum/maximum
    painter.setPen(mSampleColor);
    painter.drawText(TU::PADDING_X, mPlotRect.top(), mYAxisWidth, metrics.height(), Qt::AlignRight | Qt::AlignTop, QString::number(viewportMax));
    painter.drawText(TU::PADDING_X, _viewport->height() - TU::PADDING_Y - metrics.height(), mYAxisWidth, metrics.height(), Qt::AlignRight | Qt::AlignBottom, QString::number(viewportMin));


    // Grid lines
    painter.setPen(mLineColor);
    auto const plotTop = mPlotRect.top() - 1;
    auto const plotBottom = mPlotRect.bottom();
    auto const axis = mPlotRect.left() - 1;
    auto const viewportWidth = _viewport->width();
    painter.drawLine(axis, plotTop, axis, plotBottom);
    painter.drawLine(axis + 1, plotTop, viewportWidth, plotTop);
    painter.drawLine(axis + 1, plotBottom, viewportWidth, plotBottom);

    if (mBarMode) {
        TU::BarPlotter plotter(mPlotRect, mMinValue, mMaxValue);
        if (mLines) {
            for (int i = mMinValue + 1; i < mMaxValue; ++i) {
                auto ypos = plotter.plot((GraphModel::DataType)i);
                painter.drawLine(mPlotRect.left(), ypos, viewportWidth, ypos);
            }
        }

        // xaxis (only drawn if the minimum value isn't 0, since then it is the bottom line of the plot)
        if (mMinValue) {
            painter.drawLine(mPlotRect.left(), plotter.xaxis(), viewportWidth, plotter.xaxis());
        }

        // mouse hover
        painter.translate(QPoint(mPlotRect.x(), 0));
        painter.setPen(mSampleColor);
        if (mMouseOver) {
            painter.drawRect(
                mMouseOver->x() * mCellWidth,
                plotter.xaxis(), 
                mCellWidth, 
                plotter.plot((GraphModel::DataType)mMouseOver->y()) - plotter.xaxis()
            );
        }

        // bars
        auto count = mModel.count();
        int xpos = 1;
        for (auto i = hscroll->value(); i < count; ++i, xpos += mCellWidth) {
            auto h = plotter.plot(mModel.dataAt(i)) - plotter.xaxis();
            if (h == 0) {
                h = 1;
            }
            painter.fillRect(xpos, plotter.xaxis(), mCellWidth - 1, h, mSampleColor);
        }

    } else {
        // always draw lines for sample view
        {
            int ypos = mPlotRect.bottom() - mCellHeight;
            for (int const top = mPlotRect.top(); ypos > top; ypos -= mCellHeight) {
                painter.drawLine(mPlotRect.left(), ypos, viewportWidth, ypos);
            }
        }

        if (mAlternateInterval) {
            int ypos = mPlotRect.bottom() - TU::mod(viewportMin, mAlternateInterval) * mCellHeight;
            int skip = mAlternateInterval * mCellHeight;
            for (int const top = mPlotRect.top(); ypos > top; ypos -= skip) {
                painter.fillRect(mPlotRect.left(), ypos - mCellHeight + 1, viewportWidth, mCellHeight - 1, mAlternateColor);
            }

        }

        painter.translate(QPoint(mPlotRect.x(), mPlotRect.bottom() + viewportMin * mCellHeight));
        painter.scale(1.0, -1.0);
        painter.setPen(mSampleColor);
        
        if (mMouseOver) {
            painter.drawRect(
                mMouseOver->x() * mCellWidth,
                (mMouseOver->y() + viewportMin) * mCellHeight, 
                mCellWidth, 
                mCellHeight
            );
        }

        auto count = mModel.count();
        int xpos = 1;
        for (int i = hscroll->value(); i < count; ++i, xpos += mCellWidth) {
            auto sample = mModel.dataAt(i);
            if (sample < viewportMin || sample > viewportMax) {
                continue;
            }
            auto ypos = sample * mCellHeight;
            painter.fillRect(xpos, ypos, mCellWidth - 1, mCellHeight - 1, mSampleColor);
        }
    }

}